

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::Interaction::Interaction(Interaction *this,json *j)

{
  pointer *__ptr_4;
  pointer *__ptr;
  pointer *__ptr_2;
  pointer *__ptr_1;
  pointer *__ptr_3;
  __uniq_ptr_impl<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  local_60;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_58;
  field<discordpp::Message> *local_50;
  field<discordpp::User> *local_48;
  field<discordpp::GuildMember> *local_40;
  field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  *local_38;
  
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0;
  (this->id).s_ = uninitialized_e;
  (this->application_id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  (this->application_id).s_ = uninitialized_e;
  (this->type).t_._M_t.
  super___uniq_ptr_impl<discordpp::InteractionType,_std::default_delete<discordpp::InteractionType>_>
  ._M_t.
  super__Tuple_impl<0UL,_discordpp::InteractionType_*,_std::default_delete<discordpp::InteractionType>_>
  .super__Head_base<0UL,_discordpp::InteractionType_*,_false>._M_head_impl = (InteractionType *)0x0;
  (this->type).s_ = uninitialized_e;
  local_38 = &(this->data).
              super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  ;
  (this->data).
  super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  .t_._M_t.
  super___uniq_ptr_impl<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  .
  super__Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
  ._M_head_impl =
       (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
        *)0x0;
  local_60._M_t.
  super__Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  .
  super__Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
  ._M_head_impl =
       (tuple<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
        )(_Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
          )0x0;
  (this->data).
  super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  .s_ = omitted_e;
  std::
  unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  ::~unique_ptr((unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
                 *)&local_60);
  (this->data)._vptr_omittable_field = (_func_int **)&PTR_operator__0024ef50;
  (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  (this->guild_id).super_field<discordpp::Snowflake>.s_ = omitted_e;
  (this->guild_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  (this->channel_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  (this->channel_id).super_field<discordpp::Snowflake>.s_ = omitted_e;
  (this->channel_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  local_40 = &(this->member).super_field<discordpp::GuildMember>;
  (this->member).super_field<discordpp::GuildMember>.t_._M_t.
  super___uniq_ptr_impl<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::GuildMember_*,_std::default_delete<discordpp::GuildMember>_>.
  super__Head_base<0UL,_discordpp::GuildMember_*,_false>._M_head_impl = (GuildMember *)0x0;
  local_60._M_t.
  super__Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  .
  super__Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
  ._M_head_impl =
       (tuple<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
        )(_Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
          )0x0;
  (this->member).super_field<discordpp::GuildMember>.s_ = omitted_e;
  std::unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_>::~unique_ptr
            ((unique_ptr<discordpp::GuildMember,_std::default_delete<discordpp::GuildMember>_> *)
             &local_60);
  (this->member)._vptr_omittable_field = (_func_int **)&PTR_operator__0024efe8;
  local_48 = &(this->user).super_field<discordpp::User>;
  (this->user).super_field<discordpp::User>.t_._M_t.
  super___uniq_ptr_impl<discordpp::User,_std::default_delete<discordpp::User>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::User_*,_std::default_delete<discordpp::User>_>.
  super__Head_base<0UL,_discordpp::User_*,_false>._M_head_impl = (User *)0x0;
  local_60._M_t.
  super__Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  .
  super__Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
  ._M_head_impl =
       (tuple<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
        )(_Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
          )0x0;
  (this->user).super_field<discordpp::User>.s_ = omitted_e;
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            ((unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_> *)&local_60);
  (this->user)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e5c0;
  local_58 = &this->token;
  (this->token).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->token).s_ = uninitialized_e;
  (this->version).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  (this->version).s_ = uninitialized_e;
  local_50 = &(this->message).super_field<discordpp::Message>;
  (this->message).super_field<discordpp::Message>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Message,_std::default_delete<discordpp::Message>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Message_*,_std::default_delete<discordpp::Message>_>.
  super__Head_base<0UL,_discordpp::Message_*,_false>._M_head_impl = (Message *)0x0;
  local_60._M_t.
  super__Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  .
  super__Head_base<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_false>
  ._M_head_impl =
       (tuple<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
        )(_Tuple_impl<0UL,_std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_*,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
          )0x0;
  (this->message).super_field<discordpp::Message>.s_ = omitted_e;
  std::unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_>::~unique_ptr
            ((unique_ptr<discordpp::Message,_std::default_delete<discordpp::Message>_> *)&local_60);
  (this->message)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f038;
  (this->app_permissions).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->app_permissions).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.s_ =
       omitted_e;
  (this->app_permissions)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  (this->locale).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->locale).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.s_ =
       omitted_e;
  (this->locale)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  (this->guild_locale).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->guild_locale).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.s_ =
       omitted_e;
  (this->guild_locale)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  discordpp::from_json(j,this);
  return;
}

Assistant:

Interaction(const json &j) { from_json(j, *this); }